

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenarioCollection.h
# Opt level: O0

void __thiscall gurkenlaeufer::ScenarioCollection::ScenarioCollection(ScenarioCollection *this)

{
  ScenarioCollection *this_local;
  
  IScenarioCollection::IScenarioCollection(&this->super_IScenarioCollection);
  (this->super_IScenarioCollection)._vptr_IScenarioCollection =
       (_func_int **)&PTR__ScenarioCollection_002a4838;
  std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::list
            (&this->_scenarios);
  return;
}

Assistant:

void appendScenario(Scenario scenario)
    {
        if (scenario.tags.end() != std::find_if(scenario.tags.begin(), scenario.tags.end(), [](const Step& step) {
            if (detail::toLower(step.step) == "@ignore") {
                return true;
            }
            return false; })) {
            std::cout << "Ignore scenario " << scenario.description;
            return;
        }
        _scenarios.emplace_back(std::move(scenario));
    }